

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O0

void __thiscall license::CryptoHelperLinux::CryptoHelperLinux(CryptoHelperLinux *this)

{
  CryptoHelperLinux *this_local;
  
  CryptoHelper::CryptoHelper(&this->super_CryptoHelper);
  (this->super_CryptoHelper)._vptr_CryptoHelper = (_func_int **)&PTR_generateKeyPair_005b4fc0;
  this->m_pktmp = (EVP_PKEY *)0x0;
  if (CryptoHelperLinux::initialized == 0) {
    CryptoHelperLinux::initialized = 1;
    ERR_load_ERR_strings();
    OPENSSL_init_crypto(2,0);
    OPENSSL_init_crypto(0xc,0);
  }
  return;
}

Assistant:

CryptoHelperLinux::CryptoHelperLinux() : m_pktmp(nullptr) {
	static int initialized = 0;
	if (initialized == 0) {
		initialized = 1;
		ERR_load_ERR_strings();
		ERR_load_crypto_strings();
		OpenSSL_add_all_algorithms();
	}
}